

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O3

void __thiscall tcmalloc::CentralFreeList::Populate(CentralFreeList *this)

{
  int iVar1;
  Length n;
  LogItem b;
  LogItem c;
  LogItem d;
  Span *span;
  anon_union_8_2_4d86d181_for_Span_4 *paVar2;
  Length LVar3;
  ulong uVar4;
  anon_union_8_2_4d86d181_for_Span_4 *paVar5;
  anon_union_8_2_4d86d181_for_Span_4 *paVar6;
  anon_union_8_2_4d86d181_for_Span_4 *paVar7;
  uint uVar8;
  bool bVar9;
  undefined4 uStack_5c;
  anon_union_8_4_e5b1a622_for_u_ aStack_58;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  
  LOCK();
  iVar1 = (this->lock_).lockword_.super___atomic_base<int>._M_i;
  (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  if (iVar1 != 1) {
    SpinLock::SlowUnlock(&this->lock_);
  }
  n = *(Length *)(&DAT_00143048 + (this->size_class_ & 0xffffffff) * 8);
  span = PageHeap::NewWithSizeClass((PageHeap *)Static::pageheap_,n,(uint32_t)this->size_class_);
  if (span == (Span *)0x0) {
    d._4_4_ = uStack_4c;
    d.tag_ = 4;
    c._4_4_ = uStack_5c;
    c.tag_ = 4;
    b._4_4_ = uStack_3c;
    b.tag_ = 2;
    b.u_.unum = n << 0xd;
    c.u_.str = aStack_58.str;
    d.u_.str = aStack_48.str;
    Log(kLog,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/central_freelist.cc"
        ,0x138,(LogItem)(ZEXT816(0x1348a0) << 0x40),b,c,d);
    LOCK();
    bVar9 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
    if (bVar9) {
      (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    if (!bVar9) {
      SpinLock::SlowLock(&this->lock_);
      return;
    }
  }
  else {
    if (n != 0) {
      LVar3 = 0;
      do {
        uVar4 = span->start + LVar3;
        *(ulong *)(Static::pageheap_ + (uVar4 & 0xffff) * 8 + 0x10) =
             uVar4 & 0xffffffffffff0000 | (ulong)(uint)this->size_class_;
        LVar3 = LVar3 + 1;
      } while (n != LVar3);
    }
    paVar6 = (anon_union_8_2_4d86d181_for_Span_4 *)(span->start * 0x2000);
    uVar4 = (ulong)(int)(&DAT_00142e44)[(uint)this->size_class_];
    uVar8 = 0;
    paVar2 = &span->field_4;
    if (!CARRY8((ulong)paVar6,uVar4)) {
      paVar7 = paVar6;
      do {
        paVar5 = (anon_union_8_2_4d86d181_for_Span_4 *)(paVar7->span_iter_space + uVar4);
        if (paVar6 + n * 0x400 < paVar5) break;
        paVar2->objects = paVar7;
        uVar8 = uVar8 + 1;
        paVar2 = paVar7;
        paVar7 = paVar5;
      } while (!CARRY8((ulong)paVar5,uVar4));
    }
    paVar2->objects = (void *)0x0;
    *(uint *)&span->field_0x28 = (uint)*(ushort *)&span->field_0x2a << 0x10;
    LOCK();
    bVar9 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
    if (bVar9) {
      (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    if (!bVar9) {
      SpinLock::SlowLock(&this->lock_);
    }
    DLL_Prepend(&this->nonempty_,span);
    this->num_spans_ = this->num_spans_ + 1;
    this->counter_ = (ulong)uVar8 + this->counter_;
  }
  return;
}

Assistant:

void CentralFreeList::Populate() {
  // Release central list lock while operating on pageheap
  lock_.Unlock();
  const size_t npages = Static::sizemap()->class_to_pages(size_class_);

  Span* span = Static::pageheap()->NewWithSizeClass(npages, size_class_);
  if (span == nullptr) {
    Log(kLog, __FILE__, __LINE__,
        "tcmalloc: allocation failed", npages << kPageShift);
    lock_.Lock();
    return;
  }
  ASSERT(span->length == npages);
  // Cache sizeclass info eagerly.  Locking is not necessary.
  // (Instead of being eager, we could just replace any stale info
  // about this span, but that seems to be no better in practice.)
  for (int i = 0; i < npages; i++) {
    Static::pageheap()->SetCachedSizeClass(span->start + i, size_class_);
  }

  // Split the block into pieces and add to the free-list
  // TODO: coloring of objects to avoid cache conflicts?
  void** tail = &span->objects;
  char* ptr = reinterpret_cast<char*>(span->start << kPageShift);
  char* limit = ptr + (npages << kPageShift);
  const size_t size = Static::sizemap()->ByteSizeForClass(size_class_);
  int num = 0;

  // Note, when ptr is close to the top of address space, ptr + size
  // might overflow the top of address space before we're able to
  // detect that it exceeded limit. So we need to be careful. See
  // https://github.com/gperftools/gperftools/issues/1323.
  ASSERT(limit - size >= ptr);
  for (;;) {

#ifndef USE_ADD_OVERFLOW
    auto nextptr = reinterpret_cast<char *>(reinterpret_cast<uintptr_t>(ptr) + size);
    if (nextptr < ptr || nextptr > limit) {
      break;
    }
#else
    // Same as above, just helping compiler a bit to produce better code
    uintptr_t nextaddr;
    if (__builtin_add_overflow(reinterpret_cast<uintptr_t>(ptr), size, &nextaddr)) {
      break;
    }
    char* nextptr = reinterpret_cast<char*>(nextaddr);
    if (nextptr > limit) {
      break;
    }
#endif

    // [ptr, ptr+size) bytes are all valid bytes, so append them
    *tail = ptr;
    tail = reinterpret_cast<void**>(ptr);
    num++;
    ptr = nextptr;
  }
  ASSERT(ptr <= limit);
  ASSERT(ptr > limit - size); // same as ptr + size > limit but avoiding overflow
  *tail = nullptr;
  span->refcount = 0; // No sub-object in use yet

  // Add span to list of non-empty spans
  lock_.Lock();
  tcmalloc::DLL_Prepend(&nonempty_, span);
  ++num_spans_;
  counter_ += num;
}